

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O3

bool __thiscall ON_ScaleValue::Read(ON_ScaleValue *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  LengthUnitSystem LVar2;
  AngleUnitSystem AVar3;
  ScaleStringFormat SVar4;
  uint in_EAX;
  byte bVar5;
  uint u;
  int content_version;
  uint local_28;
  int local_24;
  
  local_28 = in_EAX;
  operator=(this,&Unset);
  local_24 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(archive,&local_24);
  if (!bVar1) {
    return false;
  }
  bVar1 = ON_BinaryArchive::ReadDouble(archive,&this->m_left_to_right_scale);
  if (((bVar1) &&
      (bVar1 = ON_BinaryArchive::ReadDouble(archive,&this->m_right_to_left_scale), bVar1)) &&
     (bVar1 = ON_BinaryArchive::ReadInt(archive,&this->m_context_locale_id), bVar1)) {
    local_28 = (uint)this->m_context_length_unit_system;
    bVar1 = ON_BinaryArchive::ReadInt(archive,&local_28);
    if (bVar1) {
      LVar2 = ON::LengthUnitSystemFromUnsigned(local_28);
      this->m_context_length_unit_system = LVar2;
      local_28 = (uint)this->m_context_angle_unit_system;
      bVar1 = ON_BinaryArchive::ReadInt(archive,&local_28);
      if (bVar1) {
        AVar3 = ON::AngleUnitSystemFromUnsigned(local_28);
        this->m_context_angle_unit_system = AVar3;
        bVar1 = ON_BinaryArchive::ReadString(archive,&this->m_scale_as_string);
        if (((bVar1) && (bVar1 = ON_LengthValue::Read(&this->m_left_length,archive), bVar1)) &&
           (bVar1 = ON_LengthValue::Read(&this->m_right_length,archive), bVar1)) {
          bVar5 = 1;
          if (local_24 < 1) goto LAB_005c2329;
          local_28 = (uint)this->m_string_format_preference;
          bVar1 = ON_BinaryArchive::ReadInt(archive,&local_28);
          if (bVar1) {
            SVar4 = ScaleStringFormatFromUnsigned(local_28);
            this->m_string_format_preference = SVar4;
            goto LAB_005c2329;
          }
        }
      }
    }
  }
  bVar5 = 0;
LAB_005c2329:
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar1 & bVar5);
}

Assistant:

bool ON_ScaleValue::Read(
  class ON_BinaryArchive& archive
)
{
  *this = ON_ScaleValue::Unset;

  int content_version = 0;
  if (!archive.BeginRead3dmAnonymousChunk(&content_version))
    return false;

  bool rc = false;
  for (;;)
  {
    if (!archive.ReadDouble(&m_left_to_right_scale))
      break;
    if (!archive.ReadDouble(&m_right_to_left_scale))
      break;
    if (!archive.ReadInt(&m_context_locale_id))
      break;

    unsigned int u;

    u = static_cast<unsigned int>(m_context_length_unit_system);
    if (!archive.ReadInt(&u))
      break;
    m_context_length_unit_system = ON::LengthUnitSystemFromUnsigned(u);

    u = static_cast<unsigned int>(m_context_angle_unit_system);
    if (!archive.ReadInt(&u))
      break;
    m_context_angle_unit_system = ON::AngleUnitSystemFromUnsigned(u);

    if (!archive.ReadString(m_scale_as_string))
      break;

    if (!m_left_length.Read(archive))
      break;
    if (!m_right_length.Read(archive))
      break;

    if (content_version >= 1)
    {
      // content version 1 added m_string_format_preference
      u = static_cast<unsigned char>(m_string_format_preference);
      if (!archive.ReadInt(&u))
        break;
      m_string_format_preference = ON_ScaleValue::ScaleStringFormatFromUnsigned(u);
    }

    rc = true;
    break;
  }

  if (!archive.EndRead3dmChunk())
    rc = false;
  return rc;
}